

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

AST * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::builtinObjectFieldsEx
          (Interpreter *this,LocationRange *loc,
          vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
          *args)

{
  pointer pVVar1;
  HeapEntity *pHVar2;
  anon_union_8_3_4e909c26_for_v *paVar3;
  HeapThunk *this_00;
  _Base_ptr p_Var4;
  allocator_type *in_RCX;
  vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
  *args_2;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  *params;
  initializer_list<jsonnet::internal::(anonymous_namespace)::Value::Type> __l;
  Value VVar5;
  HeapThunk *th;
  undefined1 local_a8 [8];
  anon_union_8_3_4e909c26_for_v aStack_a0;
  _Base_ptr local_98;
  anon_union_8_3_4e909c26_for_v *local_90;
  set<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  fields;
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  local_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fields,"objectFieldsEx",(allocator<char> *)&th);
  local_a8 = (undefined1  [8])0x100000012;
  __l._M_len = 2;
  __l._M_array = (iterator)local_a8;
  std::
  vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::vector((vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
            *)&local_48,__l,in_RCX);
  params = &local_48;
  args_2 = args;
  validateBuiltinArgs(this,loc,(string *)&fields,args,
                      (vector<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
                       *)params);
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::Value::Type,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value::Type>_>
  ::~_Vector_base(&local_48);
  std::__cxx11::string::~string((string *)&fields);
  pVVar1 = (args->
           super__Vector_base<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>
           )._M_impl.super__Vector_impl_data._M_start;
  fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fields._M_t._M_impl.super__Rb_tree_header._M_header;
  fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  objectFields((set<const_jsonnet::internal::Identifier_*,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                *)local_a8,(Interpreter *)(pVVar1->v).h,(HeapObject *)(ulong)(pVVar1[1].v.b ^ 1),
               SUB81(args_2,0));
  for (paVar3 = local_90; paVar3 != &aStack_a0;
      paVar3 = (anon_union_8_3_4e909c26_for_v *)
               std::_Rb_tree_increment((_Rb_tree_node_base *)paVar3)) {
    std::
    _Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
    ::_M_insert_unique<std::__cxx11::u32string_const&>
              ((_Rb_tree<std::__cxx11::u32string,std::__cxx11::u32string,std::_Identity<std::__cxx11::u32string>,std::less<std::__cxx11::u32string>,std::allocator<std::__cxx11::u32string>>
                *)&fields,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               paVar3[4].h);
  }
  std::
  _Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  ::~_Rb_tree((_Rb_tree<const_jsonnet::internal::Identifier_*,_const_jsonnet::internal::Identifier_*,_std::_Identity<const_jsonnet::internal::Identifier_*>,_std::less<const_jsonnet::internal::Identifier_*>,_std::allocator<const_jsonnet::internal::Identifier_*>_>
               *)local_a8);
  local_a8 = (undefined1  [8])0x0;
  aStack_a0.h = (HeapEntity *)0x0;
  local_98 = (_Base_ptr)0x0;
  VVar5 = makeArray(this,(vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                          *)local_a8);
  (this->scratch).t = ARRAY;
  (this->scratch).v = VVar5._0_8_;
  std::
  _Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  ::~_Vector_base((_Vector_base<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                   *)local_a8);
  pHVar2 = (this->scratch).v.h;
  for (p_Var4 = fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &fields._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    local_a8 = (undefined1  [8])((ulong)local_a8 & 0xffffffff00000000);
    this_00 = (anonymous_namespace)::Interpreter::
              makeHeap<jsonnet::internal::(anonymous_namespace)::HeapThunk,jsonnet::internal::Identifier_const*&,decltype(nullptr),int,decltype(nullptr)>
                        ((Interpreter *)this,&this->idArrayElement,(void **)local_a8,(int *)args_2,
                         (void **)params);
    th = this_00;
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
    ::push_back((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 *)(pHVar2 + 1),&th);
    VVar5 = makeString(this,(UString *)(p_Var4 + 1));
    aStack_a0 = VVar5._0_8_;
    local_a8._0_4_ = 0x13;
    HeapThunk::fill(this_00,(Value *)local_a8);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::_Identity<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
  ::~_Rb_tree(&fields._M_t);
  return (AST *)0x0;
}

Assistant:

const AST *builtinObjectFieldsEx(const LocationRange &loc, const std::vector<Value> &args)
    {
        validateBuiltinArgs(loc, "objectFieldsEx", args, {Value::OBJECT, Value::BOOLEAN});
        const auto *obj = static_cast<HeapObject *>(args[0].v.h);
        bool include_hidden = args[1].v.b;
        // Stash in a set first to sort them.
        std::set<UString> fields;
        for (const auto &field : objectFields(obj, !include_hidden)) {
            fields.insert(field->name);
        }
        scratch = makeArray({});
        auto &elements = static_cast<HeapArray *>(scratch.v.h)->elements;
        for (const auto &field : fields) {
            auto *th = makeHeap<HeapThunk>(idArrayElement, nullptr, 0, nullptr);
            elements.push_back(th);
            th->fill(makeString(field));
        }
        return nullptr;
    }